

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

char * nifti_xform_string(int xx)

{
  char *pcStack_10;
  int xx_local;
  
  switch(xx) {
  case 1:
    pcStack_10 = "Scanner Anat";
    break;
  case 2:
    pcStack_10 = "Aligned Anat";
    break;
  case 3:
    pcStack_10 = "Talairach";
    break;
  case 4:
    pcStack_10 = "MNI_152";
    break;
  default:
    pcStack_10 = "Unknown";
  }
  return pcStack_10;
}

Assistant:

char const *nifti_xform_string( int xx )
{
   switch( xx ){
     case NIFTI_XFORM_SCANNER_ANAT:  return "Scanner Anat" ;
     case NIFTI_XFORM_ALIGNED_ANAT:  return "Aligned Anat" ;
     case NIFTI_XFORM_TALAIRACH:     return "Talairach" ;
     case NIFTI_XFORM_MNI_152:       return "MNI_152" ;
   }
   return "Unknown" ;
}